

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# file_parser.cpp
# Opt level: O0

void __thiscall
Parser_parseInvalidModelFromFile_Test::~Parser_parseInvalidModelFromFile_Test
          (Parser_parseInvalidModelFromFile_Test *this)

{
  Parser_parseInvalidModelFromFile_Test *this_local;
  
  ~Parser_parseInvalidModelFromFile_Test(this);
  operator_delete(this,0x10);
  return;
}

Assistant:

TEST(Parser, parseInvalidModelFromFile)
{
    const std::vector<std::string> expectedIssues = {
        "LibXml2 error: Start tag expected, '<' not found.",
        "Could not get a valid XML root node from the provided input.",
    };

    libcellml::ParserPtr p = libcellml::Parser::create();
    p->parseModel(fileContents("invalid_cellml_2.0.xml"));

    EXPECT_EQ_ISSUES(expectedIssues, p);
}